

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O0

int ffptbb(fitsfile *fptr,LONGLONG firstrow,LONGLONG firstchar,LONGLONG nchars,uchar *values,
          int *status)

{
  int iVar1;
  fitsfile *fptr_00;
  long nbytes;
  fitsfile *in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  undefined8 in_R8;
  fitsfile *in_R9;
  char message [81];
  LONGLONG nrows;
  LONGLONG endrow;
  LONGLONG bytepos;
  char acStack_a8 [8];
  int *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  LONGLONG in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffffa0;
  LONGLONG in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffc0;
  int local_4;
  
  if ((in_R9->HDUposition < 1) && (0 < (long)in_RCX)) {
    if (in_RSI < 1) {
      in_R9->HDUposition = 0x133;
      local_4 = 0x133;
    }
    else if (in_RDX < 1) {
      in_R9->HDUposition = 0x134;
      local_4 = 0x134;
    }
    else {
      if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
        if (*(long *)(*(long *)(in_RDI + 2) + 0x88) < 0) {
          ffrdef((fitsfile *)bytepos,(int *)endrow);
        }
      }
      else {
        ffmahd(in_RCX,(int)((ulong)in_R8 >> 0x20),&in_R9->HDUposition,in_stack_ffffffffffffffc0);
      }
      fptr_00 = (fitsfile *)
                (((long)in_RCX + in_RDX + -2) / *(long *)(*(long *)(in_RDI + 2) + 0x3c8) + in_RSI);
      if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < (long)fptr_00) {
        if ((*(int *)(*(long *)(in_RDI + 2) + 0x38) == 0) ||
           (0 < *(long *)(*(long *)(in_RDI + 2) + 0x3e0))) {
          in_stack_ffffffffffffffb0 =
               (int *)((long)fptr_00 - *(long *)(*(long *)(in_RDI + 2) + 0x3c0));
          iVar1 = ffirow(fptr_00,(LONGLONG)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
          if (0 < iVar1) {
            snprintf(acStack_a8,0x51,"ffptbb failed to add space for %.0f new rows in table.",
                     (double)(long)in_stack_ffffffffffffffb0);
            ffpmsg((char *)0x115544);
            return in_R9->HDUposition;
          }
        }
        else {
          *(long *)(*(long *)(in_RDI + 2) + 0x3d8) =
               ((long)fptr_00 - *(long *)(*(long *)(in_RDI + 2) + 0x3c0)) *
               *(long *)(*(long *)(in_RDI + 2) + 0x3c8) + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
          *(fitsfile **)(*(long *)(in_RDI + 2) + 0x3c0) = fptr_00;
        }
      }
      nbytes = *(long *)(*(long *)(in_RDI + 2) + 0x88) +
               *(long *)(*(long *)(in_RDI + 2) + 0x3c8) * (in_RSI + -1) + in_RDX + -1;
      ffmbyt(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             in_stack_ffffffffffffff60);
      ffpbyt(in_R9,nbytes,fptr_00,in_stack_ffffffffffffffb0);
      local_4 = in_R9->HDUposition;
    }
  }
  else {
    local_4 = in_R9->HDUposition;
  }
  return local_4;
}

Assistant:

int ffptbb(fitsfile *fptr,        /* I - FITS file pointer                 */
           LONGLONG firstrow,         /* I - starting row (1 = first row)      */
           LONGLONG firstchar,        /* I - starting byte in row (1=first)    */
           LONGLONG nchars,           /* I - number of bytes to write          */
           unsigned char *values, /* I - array of bytes to write           */
           int *status)           /* IO - error status                     */
/*
  write a consecutive string of bytes to an ascii or binary table.
  This will span multiple rows of the table if nchars + firstchar is
  greater than the length of a row.
*/
{
    LONGLONG bytepos, endrow, nrows;
    char message[FLEN_ERRMSG];

    if (*status > 0 || nchars <= 0)
        return(*status);

    else if (firstrow < 1)
        return(*status=BAD_ROW_NUM);

    else if (firstchar < 1)
        return(*status=BAD_ELEM_NUM);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart < 0) /* rescan header if data undefined */
        ffrdef(fptr, status);

    endrow = ((firstchar + nchars - 2) / (fptr->Fptr)->rowlength) + firstrow;

    /* check if we are writing beyond the current end of table */
    if (endrow > (fptr->Fptr)->numrows)
    {
        /* if there are more HDUs following the current one, or */
        /* if there is a data heap, then we must insert space */
        /* for the new rows.  */
        if ( !((fptr->Fptr)->lasthdu) || (fptr->Fptr)->heapsize > 0)
        {
            nrows = endrow - ((fptr->Fptr)->numrows);

            /* ffirow also updates the heap address and numrows */
            if (ffirow(fptr, (fptr->Fptr)->numrows, nrows, status) > 0)
            {
                 snprintf(message, FLEN_ERRMSG,
                 "ffptbb failed to add space for %.0f new rows in table.",
                         (double) nrows);
                 ffpmsg(message);
                 return(*status);
            }
        }
        else
        {
            /* manally update heap starting address */
            (fptr->Fptr)->heapstart += 
            ((LONGLONG)(endrow - (fptr->Fptr)->numrows) * 
                    (fptr->Fptr)->rowlength );

            (fptr->Fptr)->numrows = endrow; /* update number of rows */
        }
    }

    /* move the i/o pointer to the start of the sequence of characters */
    bytepos = (fptr->Fptr)->datastart +
              ((fptr->Fptr)->rowlength * (firstrow - 1)) +
              firstchar - 1;

    ffmbyt(fptr, bytepos, IGNORE_EOF, status);
    ffpbyt(fptr, nchars, values, status);  /* write the bytes */

    return(*status);
}